

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp.cc
# Opt level: O1

bool __thiscall fizplex::LP::is_feasible(LP *this,DVector *x)

{
  bool bVar1;
  size_t *psVar2;
  pointer pCVar3;
  double *pdVar4;
  long lVar5;
  size_t column;
  size_t sVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_48;
  
  psVar2 = DVector::dimension(x);
  if (*psVar2 !=
      ((long)(this->cols).
             super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->cols).
             super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
    __assert_fail("x.dimension() == cols.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp.cc"
                  ,0x98,"bool fizplex::LP::is_feasible(const DVector &) const");
  }
  pCVar3 = (this->cols).
           super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->cols).super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>.
      _M_impl.super__Vector_impl_data._M_finish == pCVar3) {
    bVar1 = true;
  }
  else {
    bVar1 = true;
    lVar5 = 0;
    sVar6 = 0;
    do {
      if ((*(ulong *)((long)&pCVar3->lower + lVar5) & 0x7fffffffffffffff) < 0x7ff0000000000000) {
        pdVar4 = DVector::operator[](x,sVar6);
        dVar7 = *pdVar4;
        dVar9 = *(double *)
                 ((long)&((this->cols).
                          super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                          ._M_impl.super__Vector_impl_data._M_start)->lower + lVar5);
        if ((dVar7 < dVar9) && (1e-07 < ABS(dVar7 - dVar9))) {
          dVar8 = ABS(dVar7);
          if (ABS(dVar7) <= ABS(dVar9)) {
            dVar8 = ABS(dVar9);
          }
          if (dVar8 * 1e-06 < ABS(dVar7 - dVar9)) {
            DVector::operator[](x,sVar6);
            bVar1 = false;
          }
        }
      }
      if ((*(ulong *)((long)&((this->cols).
                              super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                              ._M_impl.super__Vector_impl_data._M_start)->upper + lVar5) &
          0x7fffffffffffffff) < 0x7ff0000000000000) {
        pdVar4 = DVector::operator[](x,sVar6);
        dVar7 = *pdVar4;
        dVar9 = *(double *)
                 ((long)&((this->cols).
                          super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                          ._M_impl.super__Vector_impl_data._M_start)->upper + lVar5);
        if ((dVar9 < dVar7) && (1e-07 < ABS(dVar7 - dVar9))) {
          dVar8 = ABS(dVar7);
          if (ABS(dVar7) <= ABS(dVar9)) {
            dVar8 = ABS(dVar9);
          }
          if (dVar8 * 1e-06 < ABS(dVar7 - dVar9)) {
            DVector::operator[](x,sVar6);
            bVar1 = false;
          }
        }
      }
      sVar6 = sVar6 + 1;
      pCVar3 = (this->cols).
               super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>._M_impl
               .super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x18;
    } while (sVar6 < (ulong)(((long)(this->cols).
                                    super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 3)
                            * -0x5555555555555555));
  }
  if ((this->rows).super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->rows).super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar6 = 0;
    do {
      if ((this->cols).super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          (this->cols).super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_48 = 0.0;
      }
      else {
        local_48 = 0.0;
        column = 0;
        do {
          dVar7 = ColMatrix::get_value(&this->A,sVar6,column);
          pdVar4 = DVector::operator[](x,column);
          local_48 = local_48 + dVar7 * *pdVar4;
          column = column + 1;
        } while (column < (ulong)(((long)(this->cols).
                                         super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->cols).
                                         super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      pdVar4 = DVector::operator[](&this->b,sVar6);
      dVar7 = ABS(local_48 - *pdVar4);
      if (1e-05 < dVar7) {
        dVar8 = ABS(*pdVar4);
        dVar9 = ABS(local_48);
        if (ABS(local_48) <= dVar8) {
          dVar9 = dVar8;
        }
        if (dVar9 * 0.0001 < dVar7) {
          DVector::operator[](&this->b,sVar6);
          bVar1 = false;
        }
      }
      sVar6 = sVar6 + 1;
    } while (sVar6 < (ulong)(((long)(this->rows).
                                    super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->rows).
                                    super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  return bVar1;
}

Assistant:

bool LP::is_feasible(const DVector &x) const {
  assert(x.dimension() == cols.size());
  bool feasible = true;
  for (size_t i = 0; i < cols.size(); i++) {
    if (is_finite(cols[i].lower) && is_lower_norm(x[i], cols[i].lower)) {
      Debug(0) << "Var " << i << " is below lower bound: " << x[i] << " < "
               << cols[i].lower << "\n";
      feasible = false;
    }
    if (is_finite(cols[i].upper) && is_greater_norm(x[i], cols[i].upper)) {
      Debug(0) << "Var " << i << " is above upper bound: " << x[i] << " > "
               << cols[i].upper << "\n";
      feasible = false;
    }
  }
  for (size_t row = 0; row < row_count(); row++) {
    double val = 0.0;
    for (size_t col = 0; col < column_count(); col++)
      val += A.get_value(row, col) * x[col];
    if (!is_eq_norm(val, b[row], 1e-4, 1e-5)) {
      Debug(0) << "Row " << row << " failed equality test ("
               << "should be: " << b[row] << ", is " << val << ")\n";
      feasible = false;
    }
  }
  return feasible;
}